

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

ObjectField *
jsonnet::internal::ObjectField::Local
          (ObjectField *__return_storage_ptr__,Fodder *fodder1,Fodder *fodder2,Fodder *fodder_l,
          Fodder *fodder_r,bool method_sugar,Identifier *id,ArgParams *params,bool trailing_comma,
          Fodder *op_fodder,AST *body,Fodder *comma_fodder)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  LocationRange local_58;
  
  paVar1 = &local_58.file.field_2;
  local_58.file._M_string_length = 0;
  local_58.file.field_2._M_local_buf[0] = '\0';
  local_58.begin.line = 0;
  local_58.begin.column = 0;
  local_58.end.line = 0;
  local_58.end.column = 0;
  local_58.file._M_dataplus._M_p = (pointer)paVar1;
  ObjectField(__return_storage_ptr__,LOCAL,fodder1,fodder2,fodder_l,fodder_r,VISIBLE,false,
              method_sugar,(AST *)0x0,id,&local_58,params,trailing_comma,op_fodder,body,(AST *)0x0,
              comma_fodder);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.file._M_dataplus._M_p,
                    CONCAT71(local_58.file.field_2._M_allocated_capacity._1_7_,
                             local_58.file.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static ObjectField Local(const Fodder &fodder1, const Fodder &fodder2, const Fodder &fodder_l,
                             const Fodder &fodder_r, bool method_sugar, const Identifier *id,
                             const ArgParams &params, bool trailing_comma, const Fodder &op_fodder,
                             AST *body, const Fodder &comma_fodder)
    {
        return ObjectField(LOCAL,
                           fodder1,
                           fodder2,
                           fodder_l,
                           fodder_r,
                           VISIBLE,
                           false,
                           method_sugar,
                           nullptr,
                           id,
                           LocationRange(),
                           params,
                           trailing_comma,
                           op_fodder,
                           body,
                           nullptr,
                           comma_fodder);
    }